

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O2

bin_mdef_t * bin_mdef_read(ps_config_t *config,char *filename)

{
  int32 *piVar1;
  int32 *piVar2;
  cd_tree_t *pcVar3;
  mdef_entry_t *pmVar4;
  ushort *puVar5;
  ushort uVar6;
  uint uVar7;
  int32 iVar8;
  int iVar9;
  uint uVar10;
  bin_mdef_t *pbVar11;
  FILE *__stream;
  size_t sVar12;
  char **ppcVar13;
  mmio_file_t *pmVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  void *pvVar18;
  cd_tree_t *pcVar19;
  uint16 **ppuVar20;
  int16 *piVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  short sVar26;
  size_t size;
  mdef_entry_t *pmVar27;
  bool bVar28;
  int32 val;
  int32 *local_60;
  int32 *local_58;
  int32 *local_50;
  mdef_entry_t **local_48;
  int32 *local_40;
  int32 *local_38;
  
  pbVar11 = bin_mdef_read_text(config,filename);
  if (pbVar11 != (bin_mdef_t *)0x0) {
    return pbVar11;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,0x150,"Reading binary model definition: %s\n",filename);
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return (bin_mdef_t *)0x0;
  }
  sVar12 = fread(&val,4,1,__stream);
  iVar8 = val;
  if (sVar12 != 1) {
    fclose(__stream);
    pcVar17 = "Failed to read byte-order marker from %s\n";
    lVar15 = 0x157;
LAB_00103bee:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                   ,lVar15,pcVar17,filename);
    return (bin_mdef_t *)0x0;
  }
  if (val == 0x424d4446) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
            ,0x15d,"Must byte-swap %s\n",filename);
  }
  sVar12 = fread(&val,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    pcVar17 = "Failed to read version from %s\n";
    lVar15 = 0x161;
    goto LAB_00103bee;
  }
  if (iVar8 == 0x424d4446) {
    val = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
  }
  if (1 < val) {
    pbVar11 = (bin_mdef_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
            ,0x168,"File format version %d for %s is newer than library\n",(ulong)(uint)val,filename
           );
    goto LAB_00103ba2;
  }
  sVar12 = fread(&val,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    pcVar17 = "Failed to read header length from %s\n";
    lVar15 = 0x16e;
    goto LAB_00103bee;
  }
  if (iVar8 == 0x424d4446) {
    val = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
  }
  fseek(__stream,(long)val,1);
  pbVar11 = (bin_mdef_t *)
            __ckd_calloc__(1,0x78,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                           ,0x177);
  pbVar11->refcnt = 1;
  local_60 = &pbVar11->n_ciphone;
  sVar12 = fread(local_60,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_ciphone";
    lVar15 = 0x184;
LAB_001040e4:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                   ,lVar15,"Failed to read %s from %s\n",pcVar17,filename);
    return (bin_mdef_t *)0x0;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *local_60;
    *local_60 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  local_38 = &pbVar11->n_phone;
  sVar12 = fread(local_38,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_phone";
    lVar15 = 0x185;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *local_38;
    *local_38 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  local_50 = &pbVar11->n_emit_state;
  sVar12 = fread(local_50,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_emit_state";
    lVar15 = 0x186;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *local_50;
    *local_50 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar1 = &pbVar11->n_ci_sen;
  sVar12 = fread(piVar1,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_ci_sen";
    lVar15 = 0x187;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar1;
    *piVar1 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar1 = &pbVar11->n_sen;
  sVar12 = fread(piVar1,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_sen";
    lVar15 = 0x188;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar1;
    *piVar1 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar2 = &pbVar11->n_tmat;
  local_58 = piVar1;
  sVar12 = fread(piVar2,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_tmat";
    lVar15 = 0x189;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar2;
    *piVar2 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar1 = &pbVar11->n_sseq;
  sVar12 = fread(piVar1,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_sseq";
    lVar15 = 0x18a;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar1;
    *piVar1 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar2 = &pbVar11->n_ctx;
  local_40 = piVar1;
  sVar12 = fread(piVar2,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_ctx";
    lVar15 = 0x18b;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar2;
    *piVar2 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar1 = &pbVar11->n_cd_tree;
  sVar12 = fread(piVar1,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->n_cd_tree";
    lVar15 = 0x18c;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar1;
    *piVar1 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  piVar1 = &pbVar11->sil;
  sVar12 = fread(piVar1,4,1,__stream);
  if (sVar12 != 1) {
    fclose(__stream);
    ckd_free(pbVar11);
    pcVar17 = "&m->sil";
    lVar15 = 0x18d;
    goto LAB_001040e4;
  }
  if (iVar8 == 0x424d4446) {
    uVar10 = *piVar1;
    *piVar1 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  }
  ppcVar13 = (char **)__ckd_calloc__((long)pbVar11->n_ciphone,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                     ,400);
  pbVar11->ciname = ppcVar13;
  if (config == (ps_config_t *)0x0) {
    if (iVar8 == 0x424d4446) goto LAB_001040fc;
LAB_0010411e:
    pmVar14 = mmio_file_read(filename);
    pbVar11->filemap = pmVar14;
    bVar28 = pmVar14 == (mmio_file_t *)0x0;
  }
  else {
    iVar9 = ps_config_bool(config,"mmap");
    if (iVar8 == 0x424d4446) {
LAB_001040fc:
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
              ,0x195,"-mmap specified, but mdef is other-endian.  Will not memory-map.\n");
    }
    else if (iVar9 != 0) goto LAB_0010411e;
    bVar28 = true;
  }
  lVar15 = ftell(__stream);
  if (bVar28) {
    pbVar11->alloc_mode = BIN_MDEF_IN_MEMORY;
    fseek(__stream,0,2);
    lVar16 = ftell(__stream);
    fseek(__stream,lVar15,0);
    size = lVar16 - lVar15;
    pcVar17 = (char *)__ckd_malloc__(size,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                     ,0x1ab);
    *pbVar11->ciname = pcVar17;
    sVar12 = fread(*pbVar11->ciname,1,size,__stream);
    if (sVar12 != size) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
              ,0x1ad,"Failed to read %d bytes of data from %s\n",size,filename);
      exit(1);
    }
  }
  else {
    pvVar18 = mmio_file_ptr(pbVar11->filemap);
    *pbVar11->ciname = (char *)((long)pvVar18 + lVar15);
    pbVar11->alloc_mode = BIN_MDEF_ON_DISK;
  }
  local_60 = (int32 *)(long)*local_60;
  for (lVar15 = 1; ppcVar13 = pbVar11->ciname, lVar15 < (long)local_60; lVar15 = lVar15 + 1) {
    pcVar17 = ppcVar13[lVar15 + -1];
    sVar12 = strlen(pcVar17);
    ppcVar13[lVar15] = pcVar17 + sVar12 + 1;
  }
  pcVar17 = ppcVar13[lVar15 + -1];
  sVar12 = strlen(pcVar17);
  pcVar19 = (cd_tree_t *)
            (*ppcVar13 + ((ulong)(pcVar17 + (sVar12 - (long)*ppcVar13) + 4) & 0xfffffffffffffffc));
  pbVar11->cd_tree = pcVar19;
  if (iVar8 == 0x424d4446) {
    lVar15 = 0;
    while( true ) {
      pcVar19 = pbVar11->cd_tree;
      if (pbVar11->n_cd_tree <= lVar15) break;
      pcVar3 = pcVar19 + lVar15;
      pcVar3->ctx = pcVar3->ctx << 8 | (ushort)pcVar3->ctx >> 8;
      piVar21 = &pcVar19[lVar15].n_down;
      *piVar21 = *piVar21 << 8 | (ushort)*piVar21 >> 8;
      uVar10 = pcVar19[lVar15].c.pid;
      pcVar19[lVar15].c.pid =
           uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      lVar15 = lVar15 + 1;
    }
    pmVar4 = (mdef_entry_t *)(pcVar19 + pbVar11->n_cd_tree);
    pbVar11->phone = pmVar4;
    uVar10 = pbVar11->n_phone;
    lVar15 = 0;
    uVar24 = 0;
    if (0 < (int)uVar10) {
      uVar24 = (ulong)uVar10;
    }
    for (; uVar24 * 0xc - lVar15 != 0; lVar15 = lVar15 + 0xc) {
      uVar22 = *(uint *)((long)&pmVar4->ssid + lVar15);
      uVar7 = *(uint *)((long)&pmVar4->tmat + lVar15);
      *(uint *)((long)&pmVar4->ssid + lVar15) =
           uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
      *(uint *)((long)&pmVar4->tmat + lVar15) =
           uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    }
    pmVar27 = pmVar4 + (int)uVar10;
    uVar22 = pmVar4[(int)uVar10].ssid;
    pmVar4[(int)uVar10].ssid =
         uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
  }
  else {
    pbVar11->phone = (mdef_entry_t *)(pcVar19 + pbVar11->n_cd_tree);
    pmVar27 = (mdef_entry_t *)(pcVar19 + pbVar11->n_cd_tree) + pbVar11->n_phone;
  }
  local_48 = &pbVar11->phone;
  ppuVar20 = (uint16 **)
             __ckd_calloc__((long)pbVar11->n_sseq,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                            ,0x1c9);
  pbVar11->sseq = ppuVar20;
  *ppuVar20 = (uint16 *)&pmVar27->tmat;
  if (iVar8 == 0x424d4446) {
    uVar23 = 0;
    uVar24 = (ulong)(uint)pmVar27->ssid;
    if (pmVar27->ssid < 1) {
      uVar24 = uVar23;
    }
    for (; uVar24 != uVar23; uVar23 = uVar23 + 1) {
      puVar5 = *pbVar11->sseq + uVar23;
      *puVar5 = *puVar5 << 8 | *puVar5 >> 8;
    }
  }
  if ((long)*local_50 == 0) {
    pbVar11->sseq_len = (uint8 *)(*pbVar11->sseq + pmVar27->ssid);
    iVar9 = pbVar11->n_sseq;
    for (lVar15 = 1; lVar15 < iVar9; lVar15 = lVar15 + 1) {
      pbVar11->sseq[lVar15] =
           (uint16 *)
           ((ulong)((uint)pbVar11->sseq_len[lVar15 + -1] * 2) + (long)pbVar11->sseq[lVar15 + -1]);
    }
  }
  else {
    iVar9 = *local_40;
    lVar16 = (long)*local_50 * 2;
    lVar25 = lVar16;
    for (lVar15 = 1; lVar15 < iVar9; lVar15 = lVar15 + 1) {
      pbVar11->sseq[lVar15] = (uint16 *)((long)*pbVar11->sseq + lVar25);
      lVar25 = lVar25 + lVar16;
    }
  }
  piVar21 = (int16 *)__ckd_malloc__((long)pbVar11->n_sen * 2,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                    ,0x1dd);
  pbVar11->cd2cisen = piVar21;
  piVar21 = (int16 *)__ckd_malloc__((long)pbVar11->n_sen * 2,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                    ,0x1de);
  pbVar11->sen2cimap = piVar21;
  uVar23 = 0;
  uVar24 = (ulong)(uint)pbVar11->n_ci_sen;
  if (pbVar11->n_ci_sen < 1) {
    uVar24 = uVar23;
  }
  for (; uVar24 != uVar23; uVar23 = uVar23 + 1) {
    pbVar11->cd2cisen[uVar23] = (int16)uVar23;
  }
  uVar10 = *local_58;
  for (; (long)uVar24 < (long)(int)uVar10; uVar24 = uVar24 + 1) {
    pbVar11->cd2cisen[uVar24] = -1;
  }
  uVar23 = 0;
  uVar24 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar24 = uVar23;
  }
  for (; uVar24 != uVar23; uVar23 = uVar23 + 1) {
    piVar21[uVar23] = -1;
  }
  for (uVar24 = 0; uVar10 = *local_38, (long)uVar24 < (long)(int)uVar10; uVar24 = uVar24 + 1) {
    local_58 = (int32 *)(uVar24 * 0xc);
    local_60 = (int32 *)(long)(*local_48)[uVar24].ssid;
    lVar15 = 0;
    while( true ) {
      uVar10 = *local_50;
      uVar22 = uVar10;
      if (uVar10 == 0) {
        uVar22 = (uint)pbVar11->sseq_len[*(int *)((long)&pbVar11->phone->ssid + (long)local_58)];
      }
      if ((int)uVar22 <= lVar15) break;
      uVar22 = (uint)uVar24;
      if ((long)pbVar11->n_ciphone <= (long)uVar24) {
        uVar22 = (uint)((*local_48)->info).ci.reserved[(long)local_58];
      }
      uVar6 = pbVar11->sseq[(long)local_60][lVar15];
      sVar26 = pbVar11->sen2cimap[uVar6];
      if (sVar26 == -1) {
        sVar26 = (short)uVar22;
        pbVar11->sen2cimap[uVar6] = sVar26;
      }
      if (uVar22 != (int)sVar26) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,499,"Senone %d is shared between multiple base phones\n");
        uVar10 = *local_50;
      }
      if (uVar10 == 0) {
        uVar10 = (uint)pbVar11->sseq_len[pbVar11->phone[uVar22].ssid];
      }
      if ((int)uVar10 < lVar15) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                ,0x1f7,"CD phone %d has fewer states than CI phone %d\n",uVar24 & 0xffffffff,
                (ulong)uVar22);
      }
      else {
        pbVar11->cd2cisen[uVar6] = pbVar11->sseq[pbVar11->phone[uVar22].ssid][lVar15];
      }
      lVar15 = lVar15 + 1;
    }
  }
  iVar9 = bin_mdef_ciphone_id(pbVar11,"SIL");
  pbVar11->sil = iVar9;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,0x204,"%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
          (ulong)(uint)pbVar11->n_ciphone,(ulong)(uVar10 - pbVar11->n_ciphone),
          (ulong)(uint)pbVar11->n_emit_state,(ulong)(uint)pbVar11->n_ci_sen,
          (ulong)(uint)pbVar11->n_sen,(ulong)(uint)pbVar11->n_sseq);
LAB_00103ba2:
  fclose(__stream);
  return pbVar11;
}

Assistant:

bin_mdef_t *
bin_mdef_read(ps_config_t *config, const char *filename)
{
    bin_mdef_t *m;
    FILE *fh;
    size_t tree_start;
    int32 val, i, do_mmap, swap;
    long pos, end;
    int32 *sseq_size;

    /* Try to read it as text first. */
    if ((m = bin_mdef_read_text(config, filename)) != NULL)
        return m;

    E_INFO("Reading binary model definition: %s\n", filename);
    if ((fh = fopen(filename, "rb")) == NULL)
        return NULL;

    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read byte-order marker from %s\n",
                       filename);
        return NULL;
    }
    swap = 0;
    if (val == BIN_MDEF_OTHER_ENDIAN) {
        swap = 1;
        E_INFO("Must byte-swap %s\n", filename);
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read version from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    if (val > BIN_MDEF_FORMAT_VERSION) {
        E_ERROR("File format version %d for %s is newer than library\n",
                val, filename);
        fclose(fh);
        return NULL;
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read header length from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    /* Skip format descriptor. */
    fseek(fh, val, SEEK_CUR);

    /* Finally allocate it. */
    m = ckd_calloc(1, sizeof(*m));
    m->refcnt = 1;

    /* Check these, to make gcc/glibc shut up. */
#define FREAD_SWAP32_CHK(dest)                                          \
    if (fread((dest), 4, 1, fh) != 1) {                                 \
        fclose(fh);                                                     \
        ckd_free(m);                                                    \
        E_ERROR_SYSTEM("Failed to read %s from %s\n", #dest, filename); \
        return NULL;                                                    \
    }                                                                   \
    if (swap) SWAP_INT32(dest);
    
    FREAD_SWAP32_CHK(&m->n_ciphone);
    FREAD_SWAP32_CHK(&m->n_phone);
    FREAD_SWAP32_CHK(&m->n_emit_state);
    FREAD_SWAP32_CHK(&m->n_ci_sen);
    FREAD_SWAP32_CHK(&m->n_sen);
    FREAD_SWAP32_CHK(&m->n_tmat);
    FREAD_SWAP32_CHK(&m->n_sseq);
    FREAD_SWAP32_CHK(&m->n_ctx);
    FREAD_SWAP32_CHK(&m->n_cd_tree);
    FREAD_SWAP32_CHK(&m->sil);

    /* CI names are first in the file. */
    m->ciname = ckd_calloc(m->n_ciphone, sizeof(*m->ciname));

    /* Decide whether to read in the whole file or mmap it. */
    do_mmap = config ? ps_config_bool(config, "mmap") : TRUE;
    if (swap) {
        E_WARN("-mmap specified, but mdef is other-endian.  Will not memory-map.\n");
        do_mmap = FALSE;
    } 
    /* Actually try to mmap it. */
    if (do_mmap) {
        m->filemap = mmio_file_read(filename);
        if (m->filemap == NULL)
            do_mmap = FALSE;
    }
    pos = ftell(fh);
    if (do_mmap) {
        /* Get the base pointer from the memory map. */
        m->ciname[0] = (char *)mmio_file_ptr(m->filemap) + pos;
        /* Success! */
        m->alloc_mode = BIN_MDEF_ON_DISK;
    }
    else {
        /* Read everything into memory. */
        m->alloc_mode = BIN_MDEF_IN_MEMORY;
        fseek(fh, 0, SEEK_END);
        end = ftell(fh);
        fseek(fh, pos, SEEK_SET);
        m->ciname[0] = ckd_malloc(end - pos);
        if (fread(m->ciname[0], 1, end - pos, fh) != (size_t)(end - pos))
            E_FATAL("Failed to read %d bytes of data from %s\n", end - pos, filename);
    }

    for (i = 1; i < m->n_ciphone; ++i)
        m->ciname[i] = m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1;

    /* Skip past the padding. */
    tree_start =
        m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1 - m->ciname[0];
    tree_start = (tree_start + 3) & ~3;
    m->cd_tree = (cd_tree_t *) (m->ciname[0] + tree_start);
    if (swap) {
        for (i = 0; i < m->n_cd_tree; ++i) {
            SWAP_INT16(&m->cd_tree[i].ctx);
            SWAP_INT16(&m->cd_tree[i].n_down);
            SWAP_INT32(&m->cd_tree[i].c.down);
        }
    }
    m->phone = (mdef_entry_t *) (m->cd_tree + m->n_cd_tree);
    if (swap) {
        for (i = 0; i < m->n_phone; ++i) {
            SWAP_INT32(&m->phone[i].ssid);
            SWAP_INT32(&m->phone[i].tmat);
        }
    }
    sseq_size = (int32 *) (m->phone + m->n_phone);
    if (swap)
        SWAP_INT32(sseq_size);
    m->sseq = ckd_calloc(m->n_sseq, sizeof(*m->sseq));
    m->sseq[0] = (uint16 *) (sseq_size + 1);
    if (swap) {
        for (i = 0; i < *sseq_size; ++i)
            SWAP_INT16(m->sseq[0] + i);
    }
    if (m->n_emit_state) {
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[0] + i * m->n_emit_state;
    }
    else {
        m->sseq_len = (uint8 *) (m->sseq[0] + *sseq_size);
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[i - 1] + m->sseq_len[i - 1];
    }

    /* Now build the CD-to-CI mappings using the senone sequences.
     * This is the only really accurate way to do it, though it is
     * still inaccurate in the case of heterogeneous topologies or
     * cross-state tying. */
    m->cd2cisen = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->cd2cisen));
    m->sen2cimap = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->sen2cimap));

    /* Default mappings (identity, none) */
    for (i = 0; i < m->n_ci_sen; ++i)
        m->cd2cisen[i] = i;
    for (; i < m->n_sen; ++i)
        m->cd2cisen[i] = -1;
    for (i = 0; i < m->n_sen; ++i)
        m->sen2cimap[i] = -1;
    for (i = 0; i < m->n_phone; ++i) {
        int32 j, ssid = m->phone[i].ssid;

        for (j = 0; j < bin_mdef_n_emit_state_phone(m, i); ++j) {
            int s = bin_mdef_sseq2sen(m, ssid, j);
            int ci = bin_mdef_pid2ci(m, i);
            /* Take the first one and warn if we have cross-state tying. */
            if (m->sen2cimap[s] == -1)
                m->sen2cimap[s] = ci;
            if (m->sen2cimap[s] != ci)
                E_WARN
                    ("Senone %d is shared between multiple base phones\n",
                     s);

            if (j > bin_mdef_n_emit_state_phone(m, ci))
                E_WARN("CD phone %d has fewer states than CI phone %d\n",
                       i, ci);
            else
                m->cd2cisen[s] =
                    bin_mdef_sseq2sen(m, m->phone[ci].ssid, j);
        }
    }

    /* Set the silence phone. */
    m->sil = bin_mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    E_INFO
        ("%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
         m->n_ciphone, m->n_phone - m->n_ciphone, m->n_emit_state,
         m->n_ci_sen, m->n_sen, m->n_sseq);
    fclose(fh);
    return m;
}